

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void anon_unknown.dwarf_db971d::ConvertUnit(DataType *dt,ConversionData *conv)

{
  undefined1 *puVar1;
  int iVar2;
  ENTITY *this;
  IfcNamedUnit *pIVar3;
  long lVar4;
  IfcMeasureWithUnit *pIVar5;
  PrimitiveDataType<double> *pPVar6;
  _func_int *p_Var7;
  IfcFloat IVar8;
  
  this = Assimp::STEP::EXPRESS::DataType::To<Assimp::STEP::EXPRESS::ENTITY>(dt);
  pIVar3 = Assimp::STEP::EXPRESS::DataType::ResolveSelect<Assimp::IFC::Schema_2x3::IfcNamedUnit>
                     ((DataType *)this,conv->db);
  puVar1 = &(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x18;
  iVar2 = std::__cxx11::string::compare(puVar1);
  if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(puVar1), iVar2 != 0)) {
    return;
  }
  p_Var7 = (_func_int *)
           ((long)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                   _vptr_ObjectHelper +
           (long)(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                 _vptr_ObjectHelper[-3]);
  lVar4 = __dynamic_cast(p_Var7,&Assimp::STEP::Object::typeinfo,
                         &Assimp::IFC::Schema_2x3::IfcSIUnit::typeinfo,0xffffffffffffffff);
  if (lVar4 == 0) {
    lVar4 = __dynamic_cast(p_Var7,&Assimp::STEP::Object::typeinfo,
                           &Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::typeinfo,
                           0xffffffffffffffff);
    if ((lVar4 != 0) && (iVar2 = std::__cxx11::string::compare((char *)(lVar4 + 0x18)), iVar2 == 0))
    {
      pIVar5 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>
                         (*(LazyObject **)(lVar4 + 0x68));
      pPVar6 = Assimp::STEP::EXPRESS::DataType::To<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                         (*(DataType **)
                           &(pIVar5->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                            field_0x10);
      conv->angle_scale = pPVar6->val;
      pIVar5 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>
                         (*(LazyObject **)(lVar4 + 0x68));
      ConvertUnit(*(DataType **)
                   &(pIVar5->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                    field_0x20,conv);
      Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4cdcc9);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)(lVar4 + 0x18));
    if (iVar2 == 0) {
      if (*(char *)(lVar4 + 0x68) == '\x01') {
        IVar8 = Assimp::IFC::ConvertSIPrefix((string *)(lVar4 + 0x48));
      }
      else {
        IVar8 = 1.0;
      }
      conv->len_scale = IVar8;
      Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4cdce3);
    }
    iVar2 = std::__cxx11::string::compare((char *)(lVar4 + 0x18));
    if ((iVar2 == 0) && (iVar2 = std::__cxx11::string::compare((char *)(lVar4 + 0x70)), iVar2 != 0))
    {
      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4cdd19);
    }
  }
  return;
}

Assistant:

void ConvertUnit(const ::Assimp::STEP::EXPRESS::DataType& dt,ConversionData& conv)
{
    try {
        const ::Assimp::STEP::EXPRESS::ENTITY& e = dt.To<::Assimp::STEP::EXPRESS::ENTITY>();

        const Schema_2x3::IfcNamedUnit& unit = e.ResolveSelect<Schema_2x3::IfcNamedUnit>(conv.db);
        if(unit.UnitType != "LENGTHUNIT" && unit.UnitType != "PLANEANGLEUNIT") {
            return;
        }

        ConvertUnit(unit,conv);
    }
    catch(std::bad_cast&) {
        // not entity, somehow
        IFCImporter::LogError("skipping unknown IfcUnit entry - expected entity");
    }
}